

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O2

shared_ptr<Liby::UdpSocket> __thiscall Liby::EventLoopGroup::creatUdpClient(EventLoopGroup *this)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int *in_RSI;
  shared_ptr<Liby::UdpSocket> sVar2;
  SockPtr sockPtr;
  element_type *local_20;
  
  local_20 = (element_type *)CONCAT71(local_20._1_7_,1);
  std::make_shared<Liby::Socket,bool>((bool *)&sockPtr);
  Socket::setNoblock(sockPtr.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     true);
  if (*in_RSI == 0) {
    puVar1 = *(undefined8 **)(in_RSI + 0x18);
  }
  else {
    puVar1 = (undefined8 *)
             (*(long *)(in_RSI + 0x18) +
              (long)((sockPtr.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     fd_ % *in_RSI) * 8 + 8);
  }
  local_20 = (element_type *)*puVar1;
  std::make_shared<Liby::UdpSocket,Liby::EventLoop*,std::shared_ptr<Liby::Socket>&>
            ((EventLoop **)this,(shared_ptr<Liby::Socket> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sockPtr.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::UdpSocket>)
         sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UdpSocket> EventLoopGroup::creatUdpClient() {
    SockPtr sockPtr = std::make_shared<Socket>(true);
    sockPtr->setNoblock();
    std::shared_ptr<UdpSocket> udpSocket =
        std::make_shared<UdpSocket>(robinLoop1(sockPtr->fd()), sockPtr);
    return udpSocket;
}